

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O1

int cram_decode_TD(char *cp,cram_block_compression_hdr *h)

{
  byte bVar1;
  uchar uVar2;
  uint uVar3;
  cram_block *b;
  uchar *puVar4;
  uchar **ppuVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uchar *puVar9;
  uint uVar10;
  size_t __size;
  long lVar11;
  size_t sVar12;
  size_t sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  int local_38;
  
  b = cram_new_block(FILE_HEADER,0);
  local_38 = -1;
  if (b != (cram_block *)0x0) {
    h->TD_blk = b;
    bVar1 = *cp;
    uVar10 = (uint)bVar1;
    lVar11 = 1;
    if ((char)bVar1 < '\0') {
      uVar3 = (uint)bVar1;
      uVar10 = (uint)(byte)cp[1];
      if (bVar1 < 0xc0) {
        uVar10 = (uVar3 & 0x3f) << 8 | uVar10;
        lVar11 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar10 = (uVar3 & 0x1f) << 0x10 | uVar10 << 8 | (uint)(byte)cp[2];
        lVar11 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar10 = (uVar3 & 0xf) << 0x18 | uVar10 << 0x10 | (uint)(byte)cp[2] << 8 | (uint)(byte)cp[3]
        ;
        lVar11 = 4;
      }
      else {
        uVar10 = (byte)cp[4] & 0xf |
                 (uint)(byte)cp[3] << 4 | (uint)(byte)cp[2] << 0xc | uVar10 << 0x14 | uVar3 << 0x1c;
        lVar11 = 5;
      }
    }
    if (uVar10 == 0) {
      h->nTL = 0;
      h->TL = (uchar **)0x0;
      cram_free_block(b);
      local_38 = (int)lVar11;
    }
    else {
      sVar12 = (size_t)(int)uVar10;
      uVar8 = b->alloc;
      sVar13 = b->byte;
      if (uVar8 <= sVar13 + sVar12) {
        do {
          auVar14._8_4_ = (int)(uVar8 >> 0x20);
          auVar14._0_8_ = uVar8;
          auVar14._12_4_ = 0x45300000;
          dVar16 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) * 1.5;
          uVar7 = (ulong)dVar16;
          __size = (long)(dVar16 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
          if (uVar8 == 0) {
            __size = 0x400;
          }
          b->alloc = __size;
          puVar4 = (uchar *)realloc(b->data,__size);
          b->data = puVar4;
          uVar8 = b->alloc;
          sVar13 = b->byte;
        } while (uVar8 <= sVar13 + sVar12);
      }
      memcpy(b->data + sVar13,cp + lVar11,sVar12);
      sVar13 = sVar12 + b->byte;
      b->byte = sVar13;
      if (b->data[sVar13 - 1] != '\0') {
        uVar7 = b->alloc;
        sVar13 = b->byte;
        uVar8 = sVar13 + 1;
        if (uVar7 <= uVar8) {
          do {
            auVar15._8_4_ = (int)(uVar7 >> 0x20);
            auVar15._0_8_ = uVar7;
            auVar15._12_4_ = 0x45300000;
            dVar16 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) * 1.5;
            uVar8 = (ulong)dVar16;
            sVar12 = (long)(dVar16 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
            if (uVar7 == 0) {
              sVar12 = 0x400;
            }
            b->alloc = sVar12;
            puVar4 = (uchar *)realloc(b->data,sVar12);
            b->data = puVar4;
            uVar7 = b->alloc;
            sVar13 = b->byte;
            uVar8 = sVar13 + 1;
          } while (uVar7 <= uVar8);
        }
        b->byte = uVar8;
        b->data[sVar13] = '\0';
      }
      puVar4 = b->data;
      uVar8 = b->byte;
      if (uVar8 == 0) {
        uVar3 = 0;
      }
      else {
        iVar6 = 0;
        uVar3 = 0;
        do {
          puVar9 = puVar4 + iVar6;
          do {
            iVar6 = iVar6 + 1;
            uVar2 = *puVar9;
            puVar9 = puVar9 + 1;
          } while (uVar2 != '\0');
          uVar3 = uVar3 + 1;
        } while ((ulong)(long)iVar6 < uVar8);
      }
      h->nTL = uVar3;
      ppuVar5 = (uchar **)calloc((ulong)uVar3,8);
      h->TL = ppuVar5;
      local_38 = -1;
      if (ppuVar5 != (uchar **)0x0) {
        local_38 = (int)cp;
        local_38 = ((int)(cp + lVar11) + uVar10) - local_38;
        if (uVar8 != 0) {
          lVar11 = 0;
          uVar7 = 0;
          iVar6 = 0;
          do {
            h->TL[lVar11] = puVar4 + uVar7;
            puVar9 = puVar4 + iVar6;
            do {
              iVar6 = iVar6 + 1;
              uVar2 = *puVar9;
              puVar9 = puVar9 + 1;
            } while (uVar2 != '\0');
            lVar11 = lVar11 + 1;
            uVar7 = (ulong)iVar6;
          } while (uVar7 < uVar8);
        }
      }
    }
  }
  return local_38;
}

Assistant:

int cram_decode_TD(char *cp, cram_block_compression_hdr *h) {
    char *op = cp;
    unsigned char *dat;
    cram_block *b;
    int32_t blk_size;
    int nTL, i, sz;

    if (!(b = cram_new_block(0, 0)))
	return -1;
    h->TD_blk = b;

    /* Decode */
    cp += itf8_get(cp, &blk_size);
    if (!blk_size) {
	h->nTL = 0;
	h->TL = NULL;
	cram_free_block(b);
        return cp - op;
    }

    BLOCK_APPEND(b, cp, blk_size);
    cp += blk_size;
    sz = cp - op;

    // Force nul termination if missing
    if (BLOCK_DATA(b)[BLOCK_SIZE(b)-1])
	BLOCK_APPEND_CHAR(b, '\0');

    /* Set up TL lookup table */
    dat = BLOCK_DATA(b);

    // Count
    for (nTL = i = 0; i < BLOCK_SIZE(b); i++) {
	nTL++;
	while (dat[i])
	    i++;
    }

    // Copy
    h->nTL = nTL;
    if (!(h->TL = calloc(h->nTL, sizeof(unsigned char *))))
	return -1;
    for (nTL = i = 0; i < BLOCK_SIZE(b); i++) {
	h->TL[nTL++] = &dat[i];
	while (dat[i])
	    i++;
    }
    
    return sz;
}